

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test::
CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test
          (CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test *this)

{
  CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test *this_local;
  
  CpuAbsoluteIndexedTest::CpuAbsoluteIndexedTest(&this->super_CpuAbsoluteIndexedTest);
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.super_Test._vptr_Test =
       (_func_int **)&PTR__CpuAbsoluteIndexedTest_eor_absy_without_page_crossing_Test_003ec868;
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, eor_absy_without_page_crossing) {
    registers.a = 0b00111100;
    registers.p = Z_FLAG | N_FLAG;
    expected.a = 0b10011001;
    expected.p = N_FLAG;
    memory_content = 0b10100101;

    run_read_instruction_without_pagecrossing(EOR_ABSY, IndexReg::Y);
}